

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-stairs.c
# Opt level: O0

_Bool borg_prep_leave_level_spells(void)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  _Bool local_9;
  
  if (borg.goal.fleeing) {
    local_9 = false;
  }
  else if (borg.trait[0x1e] < (borg.trait[0x1f] * 6) / 10) {
    local_9 = false;
  }
  else if ((borg.temp.fast) || (_Var2 = borg_spell_fail(HASTE_SELF,0xf), !_Var2)) {
    if (((byte)((borg.temp.res_fire & 1U) + (borg.temp.res_acid & 1U) + (borg.temp.res_elec & 1U) +
               (borg.temp.res_cold & 1U)) < 3) && (_Var2 = borg_spell_fail(RESISTANCE,0xf), _Var2))
    {
      borg_note("# Casting Resistance spell before leaving level.");
      borg.no_rest_prep = 21000;
      local_9 = true;
    }
    else if (((borg.temp.fastcast & 1U) == 0) && (_Var2 = borg_spell_fail(MANA_CHANNEL,0xf), _Var2))
    {
      borg_note("# Casting Mana Channel spell before leaving level.");
      borg.no_rest_prep = 6000;
      local_9 = true;
    }
    else if (((borg.temp.berserk & 1U) == 0) &&
            (_Var2 = borg_spell_fail(BERSERK_STRENGTH,0xf), _Var2)) {
      borg_note("# Casting Berserk Strength spell before leaving level.");
      borg.no_rest_prep = 10000;
      local_9 = true;
    }
    else if ((((borg.temp.hero & 1U) == 0) && (_Var2 = borg_spell_fail(HEROISM,0xf), _Var2)) &&
            (iVar1 = borg.trait[0x23], iVar3 = borg_heroism_level(), iVar3 < iVar1)) {
      borg_note("# Casting Heroism spell before leaving level.");
      borg.no_rest_prep = 3000;
      local_9 = true;
    }
    else if (((borg.temp.regen & 1U) == 0) &&
            (_Var2 = borg_spell_fail(RAPID_REGENERATION,0xf), _Var2)) {
      borg_note("# Casting Regen before leaving level.");
      borg.no_rest_prep = 6000;
      local_9 = true;
    }
    else if ((((borg.temp.smite_evil & 1U) == 0) && (borg.trait[0xc2] == 0)) &&
            (_Var2 = borg_spell_fail(SMITE_EVIL,0xf), _Var2)) {
      borg_note("# Casting Smite Evil before leaving level.");
      borg.no_rest_prep = 21000;
      local_9 = true;
    }
    else if ((((borg.temp.venom & 1U) == 0) && (borg.trait[0xd1] == 0)) &&
            (_Var2 = borg_spell_fail(VENOM,0xf), _Var2)) {
      borg_note("# Casting Venom before leaving level.");
      borg.no_rest_prep = 18000;
      local_9 = true;
    }
    else if (((borg.temp.prot_from_evil & 1U) == 0) &&
            (_Var2 = borg_spell_fail(PROTECTION_FROM_EVIL,0xf), _Var2)) {
      borg_note("# Casting PFE before leaving level.");
      borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
      local_9 = true;
    }
    else if (((borg.temp.bless & 1U) == 0) &&
            ((_Var2 = borg_spell_fail(BLESS,0xf), _Var2 ||
             (_Var2 = borg_spell_fail(DEMON_BANE,0xf), _Var2)))) {
      borg_note("# Casting blessing before leaving level.");
      borg.no_rest_prep = 11000;
      local_9 = true;
    }
    else {
      local_9 = false;
    }
  }
  else {
    borg_note("# Casting speed spell before leaving level.");
    borg.no_rest_prep = 5000;
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool borg_prep_leave_level_spells(void)
{
    /* if we are running away, just run. */
    if (borg.goal.fleeing)
        return false;

    /* if we are low on mana, don't prep. */
    if (borg.trait[BI_CURSP] < ((borg.trait[BI_MAXSP] * 6) / 10))
        return false;

    /* Cast haste */
    if (!borg.temp.fast && borg_spell_fail(HASTE_SELF, 15)) {
        borg_note("# Casting speed spell before leaving level.");
        borg.no_rest_prep = 5000;
        return true;
    }

    /* Cast resistance */
    if (borg.temp.res_fire + borg.temp.res_acid + borg.temp.res_elec
                + borg.temp.res_cold
            < 3
        && borg_spell_fail(RESISTANCE, 15)) {
        borg_note("# Casting Resistance spell before leaving level.");
        borg.no_rest_prep = 21000;
        return true;
    }

    /* Cast fastcast */
    if (!borg.temp.fastcast && borg_spell_fail(MANA_CHANNEL, 15)) {
        borg_note("# Casting Mana Channel spell before leaving level.");
        borg.no_rest_prep = 6000;
        return true;
    }

    /* Cast Berserk Strength */
    if (!borg.temp.berserk && borg_spell_fail(BERSERK_STRENGTH, 15)) {
        borg_note("# Casting Berserk Strength spell before leaving level.");
        borg.no_rest_prep = 10000;
        return true;
    }

    /* Cast heroism if above level it gives temp attribute */
    if (!borg.temp.hero && borg_spell_fail(HEROISM, 15)
        && borg.trait[BI_CLEVEL] > borg_heroism_level()) {
        borg_note("# Casting Heroism spell before leaving level.");
        borg.no_rest_prep = 3000;
        return true;
    }

    /* Cast regen just before returning to dungeon */
    if (!borg.temp.regen && borg_spell_fail(RAPID_REGENERATION, 15)) {
        borg_note("# Casting Regen before leaving level.");
        borg.no_rest_prep = 6000;
        return true;
    }

    /* Cast Smite Evil just before returning to dungeon */
    if (!borg.temp.smite_evil && !borg.trait[BI_WS_EVIL]
        && borg_spell_fail(SMITE_EVIL, 15)) {
        borg_note("# Casting Smite Evil before leaving level.");
        borg.no_rest_prep = 21000;
        return true;
    }

    /* Cast Venom just before returning to dungeon */
    if (!borg.temp.venom && !borg.trait[BI_WB_POIS]
        && borg_spell_fail(VENOM, 15)) {
        borg_note("# Casting Venom before leaving level.");
        borg.no_rest_prep = 18000;
        return true;
    }

    /* Cast PFE just before returning to dungeon */
    if (!borg.temp.prot_from_evil
        && borg_spell_fail(PROTECTION_FROM_EVIL, 15)) {
        borg_note("# Casting PFE before leaving level.");
        borg.no_rest_prep = borg.trait[BI_CLEVEL] * 1000;
        return true;
    }

    /* Cast bless prep things */
    if ((!borg.temp.bless
            && (borg_spell_fail(BLESS, 15)
                || borg_spell_fail(DEMON_BANE, 15)))) {
        borg_note("# Casting blessing before leaving level.");
        borg.no_rest_prep = 11000;
        return true;
    }
    return false;
}